

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mtc0_pwctl_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  env->CP0_PWCtl = (uint)arg1 & 0x5c00003f | env->CP0_PWCtl & 0xc0U;
  return;
}

Assistant:

void helper_mtc0_pwctl(CPUMIPSState *env, target_ulong arg1)
{
#if defined(TARGET_MIPS64)
    /* PWEn = 0. Hardware page table walking is not implemented. */
    env->CP0_PWCtl = (env->CP0_PWCtl & 0x000000C0) | (arg1 & 0x5C00003F);
#else
    env->CP0_PWCtl = (arg1 & 0x800000FF);
#endif
}